

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_cursor.hpp
# Opt level: O1

void __thiscall
jsoncons::
basic_json_cursor<char,_jsoncons::iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::next(basic_json_cursor<char,_jsoncons::iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
       *this)

{
  ser_error *this_00;
  undefined8 extraout_RAX;
  error_code ec_00;
  error_code ec;
  uint local_20 [2];
  error_category *local_18;
  
  local_20[0] = 0;
  local_18 = (error_category *)std::_V2::system_category();
  (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[8])(this,local_20);
  if (local_20[0] == 0) {
    return;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = local_20[0];
  ec_00._M_cat = local_18;
  ser_error::ser_error
            (this_00,ec_00,(this->parser_).line_,
             ((this->parser_).position_ - (this->parser_).mark_position_) + 1);
  basic_json_cursor<char,jsoncons::iterator_source<(anonymous_namespace)::MyIterator>,std::allocator<char>>
  ::next((basic_json_cursor<char,jsoncons::iterator_source<(anonymous_namespace)::MyIterator>,std::allocator<char>>
          *)this_00);
  __cxa_free_exception(this_00);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void next() override
    {
        std::error_code ec;
        next(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec,parser_.line(),parser_.column()));
        }
    }